

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O2

int to_pkcs8(char *in_path,char *out_path,char *file_pin)

{
  bool bVar1;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  void *__dest;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  char **ppcVar9;
  uint uVar10;
  size_t sStack_2190;
  uint local_2184;
  uint local_2180;
  int n;
  char *local_2178;
  long local_2170;
  FILE *local_2168;
  char *local_2160;
  key_material_t pkey [18];
  char line [4096];
  char data [4096];
  
  memset(pkey,0,0x120);
  if (in_path == (char *)0x0) {
    pcVar3 = "ERROR: A path to the input file must be supplied. Use --in <path>\n";
    sStack_2190 = 0x42;
LAB_0010299e:
    fwrite(pcVar3,sStack_2190,1,_stderr);
    return 1;
  }
  if (out_path == (char *)0x0) {
    pcVar3 = "ERROR: A path to the output file must be supplied. Use --out <path>\n";
    sStack_2190 = 0x44;
    goto LAB_0010299e;
  }
  local_2168 = fopen(in_path,"r");
  if (local_2168 == (FILE *)0x0) {
    fprintf(_stderr,"ERROR: Could not open input file %.100s for reading.\n",in_path);
    return 1;
  }
  uVar10 = 0;
  bVar1 = false;
  local_2170 = -1;
  uVar8 = 0;
  local_2178 = file_pin;
  local_2160 = out_path;
LAB_00102651:
  local_2180 = uVar8;
  pcVar3 = fgets(line,0x1000,local_2168);
  if (pcVar3 != (char *)0x0) {
    uVar10 = uVar10 + 1;
    ppcVar9 = file_tags;
    lVar7 = 0;
    uVar6 = 0xffffffff;
    while (uVar8 = (uint)lVar7, local_2184 = uVar8, uVar6 == 0xffffffff) {
      if (lVar7 == 0x12) {
        fprintf(_stderr,"ERROR: Unrecognized input line %i\n",(ulong)uVar10);
        fprintf(_stderr,"ERROR: --> %s",line);
        uVar8 = local_2180;
        goto LAB_00102651;
      }
      pcVar3 = *ppcVar9;
      sVar4 = strlen(pcVar3);
      iVar2 = strncasecmp(line,pcVar3,sVar4);
      lVar7 = lVar7 + 1;
      ppcVar9 = ppcVar9 + 1;
      uVar6 = -(uint)(iVar2 != 0) | uVar8;
    }
    pcVar3 = file_tags[(int)uVar6];
    sVar4 = strlen(pcVar3);
    uVar8 = local_2180;
    if (line[sVar4 + 1] != '\0') {
      if ((local_2180 >> (uVar6 & 0x1f) & 1) == 0) {
        pcVar3 = line + sVar4 + 1;
        uVar8 = 1 << ((byte)uVar6 & 0x1f) | local_2180;
        if (uVar6 - 2 < 0xd) {
          iVar2 = b64_pton(pcVar3,(uchar *)data,0x1000);
          if (iVar2 == -1) {
            fprintf(_stderr,"ERROR: Could not parse the base64 string on line %i.\n",(ulong)uVar10);
          }
          else {
            sVar4 = (size_t)iVar2;
            __dest = malloc(sVar4);
            pkey[(int)uVar6].big = __dest;
            if (__dest != (void *)0x0) {
              memcpy(__dest,data,sVar4);
              pkey[(int)uVar6].size = sVar4;
              goto LAB_00102651;
            }
            fwrite("ERROR: Could not allocate memory.\n",0x22,1,_stderr);
          }
        }
        else {
          if (uVar6 == 1) {
            local_2170 = strtol(pcVar3,(char **)0x0,10);
            goto LAB_00102651;
          }
          if (uVar6 != 0) goto LAB_00102651;
          iVar2 = __isoc99_sscanf(pcVar3,"v%i.%i",&local_2184,&n);
          if (iVar2 == 2) {
            if (((int)local_2184 < 2) && (n < 4 || local_2184 != 1)) goto LAB_00102651;
            fprintf(_stderr,"ERROR: Cannot parse this version of file format, v%i.%i.\n");
          }
          else {
            fprintf(_stderr,"ERROR: Invalid/unknown version string (%.100s).\n",pcVar3);
          }
        }
        bVar1 = true;
        goto LAB_00102651;
      }
      fprintf(_stderr,"ERROR: Duplicate \"%s\" field, line %i - ignored\n",pcVar3,(ulong)uVar10);
      uVar8 = local_2180;
    }
    goto LAB_00102651;
  }
  fclose(local_2168);
  pcVar3 = local_2160;
  if (bVar1) {
LAB_001028c4:
    free_key_material(pkey);
    return 1;
  }
  iVar2 = open(local_2160,0x40,0x180);
  __stream = _stderr;
  if (iVar2 == -1) {
    puVar5 = (uint *)__errno_location();
    fprintf(__stream,"ERROR: Could not open the output file: %s (errno %i)\n",pcVar3,(ulong)*puVar5)
    ;
    goto LAB_001028c4;
  }
  close(iVar2);
  crypto_init();
  uVar8 = (int)local_2170 + 1;
  if (uVar8 < 0xc) {
    if ((0xb44U >> (uVar8 & 0x1f) & 1) != 0) {
      iVar2 = save_rsa_pkcs8(pcVar3,local_2178,pkey);
      goto LAB_00102953;
    }
    if ((0x90U >> (uVar8 & 0x1f) & 1) != 0) {
      iVar2 = save_dsa_pkcs8(pcVar3,local_2178,pkey);
      goto LAB_00102953;
    }
    if (uVar8 != 0) goto LAB_00102a10;
    pcVar3 = "ERROR: The algorithm %i was not given in the file.\n";
    lVar7 = -1;
  }
  else {
LAB_00102a10:
    pcVar3 = "ERROR: The algorithm %i is not supported.\n";
    lVar7 = local_2170;
  }
  fprintf(_stderr,pcVar3,lVar7);
  iVar2 = 1;
LAB_00102953:
  crypto_final();
  free_key_material(pkey);
  return iVar2;
}

Assistant:

int to_pkcs8(char* in_path, char* out_path, char* file_pin)
{
	FILE* file_pointer = NULL;
	char line[MAX_LINE], data[MAX_LINE];
	char* value_pointer = NULL;
	int lineno = 0, m, n, error = 0, found, algorithm = DNS_KEYALG_ERROR, data_length;
	uint32_t bitfield = 0;
	key_material_t pkey[TAG_MAX];

	if (in_path == NULL)
	{
		fprintf(stderr, "ERROR: A path to the input file must be supplied. Use --in <path>\n");
		return 1;
	}

	if (out_path == NULL)
	{
		fprintf(stderr, "ERROR: A path to the output file must be supplied. Use --out <path>\n");
		return 1;
	}

	file_pointer = fopen(in_path, "r");
	if (file_pointer == NULL)
	{
		fprintf(stderr, "ERROR: Could not open input file %.100s for reading.\n", in_path);
		return 1;
	}

	// Loop over all of the lines
	while (fgets(line, MAX_LINE, file_pointer) != NULL)
	{
		lineno++;

		// Find the current text field in the BIND file.
		for (m = 0, found = -1; found == -1 && file_tags[m]; m++)
		{
			if (strncasecmp(line, file_tags[m], strlen(file_tags[m])) == 0)
			{
				found = m;
			}
		}

		// The text files is not recognized.
		if (found == -1)
		{
			fprintf(stderr, "ERROR: Unrecognized input line %i\n", lineno);
			fprintf(stderr, "ERROR: --> %s", line);
			continue;
		}

		// Point to the data for this text field.
		value_pointer = line + strlen(file_tags[found]) + 1;

		// Continue if we are at the end of the string
		if (*value_pointer == 0)
		{
			continue;
		}

		// Check that we do not get duplicates.
		if (bitfield & (1 << found))
		{
			fprintf(stderr, "ERROR: Duplicate \"%s\" field, line %i - ignored\n",
					file_tags[found], lineno);
			continue;
		}
		bitfield |= (1 << found);

		// Handle the data for this text field.
		switch (found)
		{
			case TAG_VERSION:
				if (sscanf(value_pointer, "v%i.%i", &m, &n) != 2)
				{
					fprintf(stderr, "ERROR: Invalid/unknown version string "
							"(%.100s).\n", value_pointer);
					error = 1;
					break;
				}
				if (m > FILE_MAJOR_VERSION || (m == FILE_MAJOR_VERSION && n > FILE_MINOR_VERSION))
				{
					fprintf(stderr, "ERROR: Cannot parse this version of file format, "
							"v%i.%i.\n", m, n);
					error = 1;
				}
				break;
			case TAG_ALGORITHM:
				algorithm = strtol(value_pointer, NULL, 10);
				break;
			// RSA
			case TAG_MODULUS:
			case TAG_PUBEXP:
			case TAG_PRIVEXP:
			case TAG_PRIME1:
			case TAG_PRIME2:
			case TAG_EXP1:
			case TAG_EXP2:
			case TAG_COEFF:
			// DSA
			case TAG_PRIME:
			case TAG_SUBPRIME:
			case TAG_BASE:
			case TAG_PRIVVAL:
			case TAG_PUBVAL:
				data_length = b64_pton(value_pointer, (unsigned char*)data, MAX_LINE);
				if (data_length == -1)
				{
					error = 1;
					fprintf(stderr, "ERROR: Could not parse the base64 string on line %i.\n", lineno);
				}
				else
				{
					pkey[found].big = malloc(data_length);
					if (!pkey[found].big)
					{
						fprintf(stderr, "ERROR: Could not allocate memory.\n");
						error = 1;
						break;
					}
					memcpy(pkey[found].big, data, data_length);
					pkey[found].size = data_length;
				}
				break;
			// Do not need these
			case TAG_CREATED:
			case TAG_PUBLISH:
			case TAG_ACTIVATE:
			default:
				break;
		}
	}

	fclose(file_pointer);

	// Something went wrong. Clean up and quit.
	if (error)
	{
		free_key_material(pkey);
		return error;
	}

	// Create and set file permissions if the file does not exist.
	int fd = open(out_path, O_CREAT, S_IRUSR | S_IWUSR);
	if (fd == -1)
	{
		fprintf(stderr, "ERROR: Could not open the output file: %s (errno %i)\n",
			out_path, errno);
		free_key_material(pkey);
		return 1;
	}
	::close(fd);

	crypto_init();

	// Save the the key to the disk
	switch (algorithm)
	{
		case DNS_KEYALG_ERROR:
			fprintf(stderr, "ERROR: The algorithm %i was not given in the file.\n",
					algorithm);
			error = 1;
			break;
		case DNS_KEYALG_RSAMD5:
		case DNS_KEYALG_RSASHA1:
		case DNS_KEYALG_RSASHA1_NSEC3_SHA1:
		case DNS_KEYALG_RSASHA256:
		case DNS_KEYALG_RSASHA512:
			error = save_rsa_pkcs8(out_path, file_pin, pkey);
			break;
		case DNS_KEYALG_DSA:
		case DNS_KEYALG_DSA_NSEC3_SHA1:
			error = save_dsa_pkcs8(out_path, file_pin, pkey);
			break;
		case DNS_KEYALG_ECC:
		case DNS_KEYALG_ECC_GOST:
		default:
			fprintf(stderr, "ERROR: The algorithm %i is not supported.\n",
					algorithm);
			error = 1;
			break;
	}

	crypto_final();
	free_key_material(pkey);

	return error;
}